

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addFilter(TestSpecParser *this)

{
  bool bVar1;
  Filter *in_RDI;
  Filter *in_stack_ffffffffffffffb8;
  undefined1 local_38 [8];
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = std::
          vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
          ::empty(in_stack_ffffffffffffffd0);
  if ((!bVar1) ||
     (bVar1 = std::
              vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
              ::empty(in_stack_ffffffffffffffd0), !bVar1)) {
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::push_back
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)in_RDI,
               in_stack_ffffffffffffffb8);
    memset(local_38,0,0x30);
    TestSpec::Filter::Filter(in_RDI);
    TestSpec::Filter::operator=(in_RDI,in_stack_ffffffffffffffb8);
    TestSpec::Filter::~Filter(in_RDI);
  }
  return;
}

Assistant:

void TestSpecParser::addFilter() {
        if( !m_currentFilter.m_required.empty() || !m_currentFilter.m_forbidden.empty() ) {
            m_testSpec.m_filters.push_back( CATCH_MOVE(m_currentFilter) );
            m_currentFilter = TestSpec::Filter();
        }
    }